

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O3

bool burst::detail::
     collect_impl<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
               __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
               long *param_3,long *param_4)

{
  long lVar1;
  anon_class_40_5_aef1ef96 __f;
  long lVar2;
  long lVar3;
  long lVar4;
  bool is_sorted;
  unsigned_long previous;
  bool local_74;
  undefined1 local_73;
  undefined1 local_72 [2];
  long **local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined8 *puStack_58;
  bool *local_50;
  undefined8 local_48;
  long *local_40;
  anon_class_40_5_aef1ef96 local_38;
  
  local_70 = &local_40;
  puStack_58 = &local_48;
  local_48 = 0;
  local_50 = &local_74;
  local_74 = true;
  puStack_68 = local_72;
  local_60 = &local_73;
  __f.map = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)puStack_68;
  __f.counters = (long (**) [256])local_70;
  __f.radix = (low_byte_fn *)local_60;
  __f.previous = puStack_58;
  __f.is_sorted = local_50;
  local_40 = param_3;
  std::
  for_each<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::detail::collect_impl<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>)::_lambda(auto:1_const&)_1_>
            (&local_38,first,last,__f);
  lVar2 = *local_40;
  lVar3 = 8;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x800);
  *param_4 = lVar2;
  lVar2 = local_40[0x100];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x808);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x808) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[1] = lVar2;
  lVar2 = local_40[0x200];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x1008);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x1008) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[2] = lVar2;
  lVar2 = local_40[0x300];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x1808);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x1808) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[3] = lVar2;
  lVar2 = local_40[0x400];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x2008);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x2008) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[4] = lVar2;
  lVar2 = local_40[0x500];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x2808);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x2808) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[5] = lVar2;
  lVar2 = local_40[0x600];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x3008);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x3008) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[6] = lVar2;
  lVar2 = local_40[0x700];
  lVar3 = 0;
  lVar4 = lVar2;
  do {
    lVar1 = *(long *)((long)local_40 + lVar3 + 0x3808);
    if (lVar2 <= lVar1) {
      lVar2 = lVar1;
    }
    lVar4 = lVar4 + lVar1;
    *(long *)((long)local_40 + lVar3 + 0x3808) = lVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x7f8);
  param_4[7] = lVar2;
  return local_74;
}

Assistant:

bool collect_impl (ForwardIterator first, ForwardIterator last, Map map, Radix radix, RandomAccessIterator1 counters, RandomAccessIterator2 maximums, std::index_sequence<Radices...>)
        {
            using value_type = iterator_value_t<ForwardIterator>;
            constexpr auto radix_value_range = radix_sort_traits<value_type, Map, Radix>::radix_value_range;

            auto previous = std::numeric_limits<invoke_result_t<Map, value_type>>::min();
            auto is_sorted = true;
            std::for_each(first, last,
                [& counters, & map, & radix, & previous, & is_sorted] (const auto & preimage)
                {
                    auto image = map(preimage);
                    is_sorted &= (image >= previous);
                    previous = image;

                    BURST_EXPAND_VARIADIC(++counters[Radices][nth_radix(Radices, radix)(image)]);
                });

            BURST_EXPAND_VARIADIC(maximums[Radices] = partial_sum_max(counters[Radices], counters[Radices] + radix_value_range, counters[Radices]).second);

            return is_sorted;
        }